

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O3

string * __thiscall
t_py_generator::render_field_default_value_abi_cxx11_
          (string *__return_storage_ptr__,t_py_generator *this,t_field *tfield)

{
  t_type *type;
  
  type = t_type::get_true_type(tfield->type_);
  if (tfield->value_ == (t_const_value *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"None","");
  }
  else {
    render_const_value_abi_cxx11_(__return_storage_ptr__,this,type,tfield->value_);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_py_generator::render_field_default_value(t_field* tfield) {
  t_type* type = get_true_type(tfield->get_type());
  if (tfield->get_value() != nullptr) {
    return render_const_value(type, tfield->get_value());
  } else {
    return "None";
  }
}